

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O2

void __thiscall
LinuxEvents<0>::end(LinuxEvents<0> *this,
                   vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *results)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  ssize_t sVar5;
  uint32_t i;
  ulong uVar6;
  allocator local_39;
  string local_38;
  
  uVar6 = 1;
  iVar4 = ioctl(this->fd,0x2401,1);
  if (iVar4 == -1) {
    std::__cxx11::string::string((string *)&local_38,"ioctl(PERF_EVENT_IOC_DISABLE)",&local_39);
    report_error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  puVar1 = (this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = read(this->fd,puVar1,
               (long)(this->temp_result_vec).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1);
  if (sVar5 == -1) {
    std::__cxx11::string::string((string *)&local_38,"read",&local_39);
    report_error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  puVar1 = (this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->temp_result_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (results->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (; uVar6 < (ulong)((long)puVar2 - (long)puVar1 >> 3); uVar6 = (ulong)((int)uVar6 + 2)) {
    puVar3[uVar6 >> 1] = puVar1[uVar6];
  }
  return;
}

Assistant:

inline void end(std::vector<unsigned long long> &results) {
    if (ioctl(fd, PERF_EVENT_IOC_DISABLE, PERF_IOC_FLAG_GROUP) == -1) {
      report_error("ioctl(PERF_EVENT_IOC_DISABLE)");
    }

    if (read(fd, &temp_result_vec[0], temp_result_vec.size() * 8) == -1) {
      report_error("read");
    }
    // our actual results are in slots 1,3,5, ... of this structure
    // we really should be checking our ids obtained earlier to be safe
    for (uint32_t i = 1; i < temp_result_vec.size(); i += 2) {
      results[i / 2] = temp_result_vec[i];
    }
  }